

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataWriteIntoFileGz
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  int **ppiVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  gzFile file;
  uint *puVar7;
  int iVar8;
  long lVar9;
  
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    puts("Cnf_WriteIntoFile(): Output file cannot be opened.");
    return;
  }
  gzprintf(file,"c Result of efficient AIG-to-CNF conversion using package CNF\n");
  gzprintf(file,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  if (vForAlls != (Vec_Int_t *)0x0) {
    gzprintf(file,"a ");
    for (iVar8 = 0; iVar8 < vForAlls->nSize; iVar8 = iVar8 + 1) {
      iVar5 = Vec_IntEntry(vForAlls,iVar8);
      gzprintf(file,"%d ",(ulong)(iVar5 + (uint)(fReadable == 0)));
    }
    gzprintf(file,"0\n");
  }
  if (vExists != (Vec_Int_t *)0x0) {
    gzprintf(file,"e ");
    for (iVar8 = 0; iVar8 < vExists->nSize; iVar8 = iVar8 + 1) {
      iVar5 = Vec_IntEntry(vExists,iVar8);
      gzprintf(file,"%d ",(ulong)(iVar5 + (uint)(fReadable == 0)));
    }
    gzprintf(file,"0\n");
  }
  lVar9 = 0;
  while (lVar9 < p->nClauses) {
    ppiVar1 = p->pClauses + lVar9;
    puVar3 = (uint *)p->pClauses[lVar9 + 1];
    lVar9 = lVar9 + 1;
    for (puVar7 = (uint *)*ppiVar1; puVar7 < puVar3; puVar7 = puVar7 + 1) {
      uVar2 = *puVar7;
      uVar6 = (int)uVar2 >> 1;
      if (fReadable == 0) {
        uVar4 = ~uVar6;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar6 + 1;
        }
      }
      else {
        uVar4 = -uVar6;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar6;
        }
      }
      gzprintf(file,"%d ",(ulong)uVar4);
    }
    gzprintf(file,"0\n");
  }
  gzprintf(file,"\n");
  gzclose(file);
  return;
}

Assistant:

void Cnf_DataWriteIntoFileGz( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    gzFile pFile;
    int * pLit, * pStop, i, VarId;
    pFile = gzopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    gzprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    gzprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        gzprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        gzprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            gzprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        gzprintf( pFile, "0\n" );
    }
    gzprintf( pFile, "\n" );
    gzclose( pFile );
}